

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O0

bool FixBuildPalette(BYTE *opal,int lump,bool blood)

{
  int iVar1;
  void *pvVar2;
  int local_40;
  int c;
  BYTE *ipal;
  FMemLump data;
  bool blood_local;
  int lump_local;
  BYTE *opal_local;
  
  data.Block.Chars._3_1_ = blood;
  data.Block.Chars._4_4_ = lump;
  iVar1 = FWadCollection::LumpLength(&Wads,lump);
  if (iVar1 < 0x300) {
    opal_local._7_1_ = false;
  }
  else {
    FWadCollection::ReadLump((FWadCollection *)&ipal,0x1f756a0);
    pvVar2 = FMemLump::GetMem((FMemLump *)&ipal);
    for (local_40 = 0; local_40 < 0x300; local_40 = local_40 + 3) {
      if ((data.Block.Chars._3_1_ & 1) == 0) {
        opal[local_40] =
             *(char *)((long)pvVar2 + (long)(0x2fd - local_40)) << 2 |
             (byte)((int)(uint)*(byte *)((long)pvVar2 + (long)(0x2fd - local_40)) >> 4);
        opal[local_40 + 1] =
             *(char *)((long)pvVar2 + (long)(0x2fe - local_40)) << 2 |
             (byte)((int)(uint)*(byte *)((long)pvVar2 + (long)(0x2fe - local_40)) >> 4);
        opal[local_40 + 2] =
             *(char *)((long)pvVar2 + (long)(0x2ff - local_40)) << 2 |
             (byte)((int)(uint)*(byte *)((long)pvVar2 + (long)(0x2ff - local_40)) >> 4);
      }
      else {
        opal[local_40] = *(BYTE *)((long)pvVar2 + (long)(0x2fd - local_40));
        opal[local_40 + 1] = *(BYTE *)((long)pvVar2 + (long)(0x2fe - local_40));
        opal[local_40 + 2] = *(BYTE *)((long)pvVar2 + (long)(0x2ff - local_40));
      }
    }
    opal_local._7_1_ = true;
    FMemLump::~FMemLump((FMemLump *)&ipal);
  }
  return opal_local._7_1_;
}

Assistant:

static bool FixBuildPalette (BYTE *opal, int lump, bool blood)
{
	if (Wads.LumpLength (lump) < 768)
	{
		return false;
	}

	FMemLump data = Wads.ReadLump (lump);
	const BYTE *ipal = (const BYTE *)data.GetMem();
	
	// Reverse the palette because BUILD used entry 255 as
	// transparent, but we use 0 as transparent.

	for (int c = 0; c < 768; c += 3)
	{
		if (!blood)
		{
			opal[c] =	(ipal[765-c] << 2) | (ipal[765-c] >> 4);
			opal[c+1] = (ipal[766-c] << 2) | (ipal[766-c] >> 4);
			opal[c+2] = (ipal[767-c] << 2) | (ipal[767-c] >> 4);
		}
		else
		{
			opal[c] = ipal[765-c];
			opal[c+1] = ipal[766-c];
			opal[c+2] = ipal[767-c];
		}
	}
	return true;
}